

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Write<signed_char> __thiscall
Omega_h::unmap<long>(Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width)

{
  size_type *psVar1;
  Alloc *pAVar2;
  Int IVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  void *extraout_RDX;
  ulong uVar7;
  int n;
  size_t sVar8;
  Write<signed_char> WVar9;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  string __str;
  ScopedTimer local_d1;
  undefined1 local_d0 [32];
  void *local_b0;
  Alloc *local_a8;
  void *local_a0;
  Int local_94;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_60 = *puVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar6;
    local_70 = (ulong *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_90 = local_80;
  local_94 = width;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x02');
  *(undefined2 *)local_90 = 0x3637;
  uVar7 = 0xf;
  if (local_70 != &local_60) {
    uVar7 = local_60;
  }
  if (uVar7 < (ulong)(local_88 + local_68)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00307453;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_00307453:
  local_d0._0_8_ = local_d0 + 0x10;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    local_d0._16_8_ = *psVar1;
    local_d0._24_8_ = puVar5[3];
  }
  else {
    local_d0._16_8_ = *psVar1;
    local_d0._0_8_ = (size_type *)*puVar5;
  }
  local_d0._8_8_ = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("unmap",(char *)local_d0._0_8_);
  plVar4 = (long *)(local_d0 + 0x10);
  if ((long *)local_d0._0_8_ != plVar4) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  IVar3 = local_94;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar2 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar8 = pAVar2->size;
  }
  else {
    sVar8 = (ulong)pAVar2 >> 3;
  }
  local_d0._0_8_ = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  n = (int)(sVar8 >> 2);
  Write<long>::Write((Write<long> *)this,n * IVar3,(string *)local_d0);
  if ((long *)local_d0._0_8_ != plVar4) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  local_d0._0_8_ = (a2b->write_).shared_alloc_.alloc;
  if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0._0_8_ = ((Alloc *)local_d0._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_d0._0_8_)->use_count = ((Alloc *)local_d0._0_8_)->use_count + 1;
    }
  }
  local_d0._8_8_ = (a2b->write_).shared_alloc_.direct_ptr;
  local_d0._16_4_ = IVar3;
  local_d0._24_8_ = *(undefined8 *)this;
  if ((local_d0._24_8_ & 7) == 0 && (long *)local_d0._24_8_ != (long *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0._24_8_ = *(long *)local_d0._24_8_ * 8 + 1;
    }
    else {
      *(int *)(local_d0._24_8_ + 0x30) = (int)*(long *)(local_d0._24_8_ + 0x30) + 1;
    }
  }
  local_b0 = *(void **)(this + 8);
  local_a8 = (b_data->write_).shared_alloc_.alloc;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  local_a0 = (b_data->write_).shared_alloc_.direct_ptr;
  parallel_for<Omega_h::unmap<long>(Omega_h::Read<int>,Omega_h::Read<long>,int)::_lambda(int)_1_>
            (n,(type *)local_d0);
  unmap<long>(Omega_h::Read<int>,Omega_h::Read<long>,int)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_d0);
  ScopedTimer::~ScopedTimer(&local_d1);
  WVar9.shared_alloc_.direct_ptr = extraout_RDX;
  WVar9.shared_alloc_.alloc = (Alloc *)this;
  return (Write<signed_char>)WVar9.shared_alloc_;
}

Assistant:

Write<T> unmap(LOs a2b, Read<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      a_data[a * width + j] = b_data[b * width + j];
    }
  };
  parallel_for(na, std::move(f));
  return a_data;
}